

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

void rshift(Bigint *b,int k)

{
  ULong *pUVar1;
  ULong *pUVar2;
  uint uVar3;
  int iVar4;
  ULong *pUVar5;
  sbyte sVar6;
  uint *puVar7;
  uint uVar8;
  
  pUVar1 = b->x;
  uVar8 = (uint)k >> 5;
  pUVar5 = pUVar1;
  if ((int)uVar8 < b->wds) {
    pUVar2 = pUVar1 + (uint)b->wds;
    if ((k & 0x1fU) == 0) {
      do {
        puVar7 = (uint *)((long)pUVar5 + (ulong)(uVar8 << 2));
        *pUVar5 = *puVar7;
        pUVar5 = pUVar5 + 1;
      } while (puVar7 + 1 < pUVar2);
    }
    else {
      puVar7 = pUVar1 + uVar8 + 1;
      sVar6 = (sbyte)(k & 0x1fU);
      uVar8 = pUVar1[uVar8] >> sVar6;
      if (puVar7 < pUVar2) {
        do {
          uVar3 = *puVar7;
          *pUVar5 = uVar3 << (0x20U - sVar6 & 0x1f) | uVar8;
          uVar8 = uVar3 >> sVar6;
          pUVar5 = pUVar5 + 1;
          puVar7 = puVar7 + 1;
        } while (puVar7 < pUVar2);
      }
      *pUVar5 = uVar8;
      pUVar5 = pUVar5 + (uVar8 != 0);
    }
  }
  iVar4 = (int)((ulong)((long)pUVar5 - (long)pUVar1) >> 2);
  b->wds = iVar4;
  if (iVar4 == 0) {
    *pUVar1 = 0;
  }
  return;
}

Assistant:

static void
rshift(Bigint *b, int k)
{
	ULong *x, *x1, *xe, y;
	int n;

	x = x1 = b->x;
	n = k >> kshift;
	if (n < b->wds) {
		xe = x + b->wds;
		x += n;
		if (k &= kmask) {
			n = 32 - k;
			y = *x++ >> k;
			while(x < xe) {
				*x1++ = (y | (*x << n)) & 0xffffffff;
				y = *x++ >> k;
				}
			if ((*x1 = y) !=0)
				x1++;
			}
		else
			while(x < xe)
				*x1++ = *x++;
		}
	if ((b->wds = x1 - b->x) == 0)
		b->x[0] = 0;
	}